

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_ManFaultAddOne(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,Vec_Int_t *vLits,int nFuncVars
                      ,int fAddOr,Gia_Man_t *pGiaCnf)

{
  uint uVar1;
  lit *begin;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int Lit;
  uint local_4c;
  int local_48;
  int local_44;
  long local_40;
  Cnf_Dat_t *local_38;
  
  local_38 = pCnf;
  p = Gia_ManFaultCofactor(pM,vLits);
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  iVar3 = sat_solver_nvars(pSat);
  uVar8 = (ulong)(uint)p->nObjs;
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar7 = 0;
    do {
      if ((int)uVar8 <= lVar7) goto LAB_00535667;
      iVar9 = p_00->pVarNums[lVar7];
      if (-1 < iVar9) {
        p_00->pVarNums[lVar7] = iVar9 + iVar3;
      }
      lVar7 = lVar7 + 1;
      uVar8 = (ulong)p->nObjs;
    } while (lVar7 < (long)uVar8);
  }
  local_40 = CONCAT44(local_40._4_4_,nFuncVars);
  if (0 < p_00->nLiterals) {
    piVar5 = *p_00->pClauses;
    lVar7 = 0;
    do {
      piVar5[lVar7] = piVar5[lVar7] + iVar3 * 2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < p_00->nLiterals);
  }
  lVar7 = 0;
  do {
    if (p_00->nClauses <= lVar7) {
      if (fAddOr == 0) {
        pVVar4 = p->vCos;
        uVar8 = (ulong)(uint)pVVar4->nSize;
        if (pVVar4->nSize <= p->nRegs) goto LAB_005354d5;
        lVar7 = 0;
        goto LAB_00535393;
      }
      iVar9 = p->vCos->nSize - p->nRegs;
      pVVar4 = (Vec_Int_t *)malloc(0x10);
      iVar3 = 0x10;
      if (0xe < iVar9 - 1U) {
        iVar3 = iVar9;
      }
      pVVar4->nSize = 0;
      pVVar4->nCap = iVar3;
      if (iVar3 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((long)iVar3 << 2);
      }
      pVVar4->pArray = piVar5;
      pVVar6 = p->vCos;
      uVar8 = (ulong)(uint)pVVar6->nSize;
      if (pVVar6->nSize <= p->nRegs) goto LAB_0053548f;
      lVar7 = 0;
      goto LAB_0053542b;
    }
    iVar3 = sat_solver_addclause(pSat,p_00->pClauses[lVar7],p_00->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
  } while (iVar3 != 0);
LAB_00535322:
  iVar3 = 0;
  goto LAB_00535626;
  while( true ) {
    if (p_00->pVarNums[iVar3] < 0) goto LAB_005356a5;
    local_44 = p_00->pVarNums[iVar3] * 2 + 1;
    iVar3 = sat_solver_addclause(pSat,&local_44,(lit *)&local_40);
    if (iVar3 == 0) goto LAB_00535322;
    lVar7 = lVar7 + 1;
    pVVar4 = p->vCos;
    uVar8 = (ulong)pVVar4->nSize;
    if ((long)(uVar8 - (long)p->nRegs) <= lVar7) break;
LAB_00535393:
    if ((int)uVar8 <= lVar7) goto LAB_00535686;
    iVar3 = pVVar4->pArray[lVar7];
    if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00535648;
    if (p->pObjs == (Gia_Obj_t *)0x0) break;
  }
  goto LAB_005354d5;
LAB_0053542b:
  do {
    if ((int)uVar8 <= lVar7) goto LAB_00535686;
    iVar3 = pVVar6->pArray[lVar7];
    if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00535648;
    if (p->pObjs == (Gia_Obj_t *)0x0) break;
    if (p_00->pVarNums[iVar3] < 0) {
LAB_005356a5:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    local_44 = p_00->pVarNums[iVar3] * 2;
    Vec_IntPush(pVVar4,local_44);
    lVar7 = lVar7 + 1;
    pVVar6 = p->vCos;
    uVar8 = (ulong)pVVar6->nSize;
  } while (lVar7 < (long)(uVar8 - (long)p->nRegs));
LAB_0053548f:
  begin = pVVar4->pArray;
  iVar3 = sat_solver_addclause(pSat,begin,begin + pVVar4->nSize);
  if (iVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x3ba,
                  "int Gia_ManFaultAddOne(Gia_Man_t *, Cnf_Dat_t *, sat_solver *, Vec_Int_t *, int, int, Gia_Man_t *)"
                 );
  }
  if (begin != (lit *)0x0) {
    free(begin);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
LAB_005354d5:
  iVar3 = 1;
  if (pGiaCnf != (Gia_Man_t *)0x0) {
    pVVar4 = pGiaCnf->vCis;
    uVar8 = (ulong)(uint)pVVar4->nSize;
    if (pGiaCnf->nRegs < pVVar4->nSize) {
      lVar7 = (long)(int)local_40;
      lVar10 = 0;
      local_40 = lVar7;
      do {
        if ((int)uVar8 <= lVar10) {
LAB_00535686:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = pVVar4->pArray[lVar10];
        if (((long)iVar3 < 0) || (pGiaCnf->nObjs <= iVar3)) goto LAB_00535648;
        if (pGiaCnf->pObjs == (Gia_Obj_t *)0x0) break;
        if (lVar7 <= lVar10) {
          if (pGiaCnf->nObjs <= iVar3) {
LAB_00535667:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          lVar7 = (long)p->vCis->nSize;
          if (lVar7 - p->nRegs <= lVar10) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar7 <= lVar10) goto LAB_00535686;
          iVar9 = p->vCis->pArray[lVar10];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_00535648:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar1 = p_00->pVarNums[iVar9];
          if ((int)(uVar1 | local_38->pVarNums[iVar3]) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x13f,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
          }
          uVar2 = local_38->pVarNums[iVar3] * 2;
          local_48 = uVar1 * 2 + 1;
          local_4c = uVar2;
          iVar3 = sat_solver_addclause(pSat,(lit *)&local_4c,&local_44);
          lVar7 = local_40;
          if (iVar3 != 0) {
            local_48 = uVar1 * 2;
            local_4c = uVar2 | 1;
            sat_solver_addclause(pSat,(lit *)&local_4c,&local_44);
            lVar7 = local_40;
          }
        }
        lVar10 = lVar10 + 1;
        pVVar4 = pGiaCnf->vCis;
        uVar8 = (ulong)pVVar4->nSize;
      } while (lVar10 < (long)(uVar8 - (long)pGiaCnf->nRegs));
      iVar3 = 1;
    }
  }
LAB_00535626:
  Cnf_DataFree(p_00);
  Gia_ManStop(p);
  return iVar3;
}

Assistant:

int Gia_ManFaultAddOne( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, Vec_Int_t * vLits, int nFuncVars, int fAddOr, Gia_Man_t * pGiaCnf )
{
    Gia_Man_t * pC;//, * pTemp;
    Cnf_Dat_t * pCnf2;
    Gia_Obj_t * pObj;
    int i, Lit;
    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vLits );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );
    Cnf_DataLiftGia( pCnf2, pC, sat_solver_nvars(pSat) );
    // add timeframe clauses
    for ( i = 0; i < pCnf2->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf2->pClauses[i], pCnf2->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf2 );
            Gia_ManStop( pC );
            return 0;
        }
    // add constraint clauses
    if ( fAddOr )
    {
        // add one OR gate to assert difference of at least one output of the miter
        Vec_Int_t * vOrGate = Vec_IntAlloc( Gia_ManPoNum(pC) );
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 0 );
            Vec_IntPush( vOrGate, Lit );
        }
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vOrGate), Vec_IntArray(vOrGate) + Vec_IntSize(vOrGate) ) )
            assert( 0 );
        Vec_IntFree( vOrGate );
    }
    else
    {
        // add negative literals to assert equality of all outputs of the miter
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 1 );
            if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            {
                Cnf_DataFree( pCnf2 );
                Gia_ManStop( pC );
                return 0;
            }
        }
    }
    // add connection clauses
    if ( pGiaCnf )
    {
        Gia_ManForEachPi( pGiaCnf, pObj, i )
            if ( i >= nFuncVars )
                sat_solver_add_buffer( pSat, pCnf->pVarNums[Gia_ObjId(pGiaCnf, pObj)], pCnf2->pVarNums[Gia_ObjId(pC, Gia_ManPi(pC, i))], 0 );
    }
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}